

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_iter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d5c8::
ARTIteratorTest_singleLeafIteratorOneValue_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::ARTIteratorTest_singleLeafIteratorOneValue_Test
          (ARTIteratorTest_singleLeafIteratorOneValue_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  ARTIteratorTest_singleLeafIteratorOneValue_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  ARTIteratorTest<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::ARTIteratorTest(&this->
                     super_ARTIteratorTest<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                   );
  (this->
  super_ARTIteratorTest<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ).super_Test._vptr_Test =
       (_func_int **)&PTR__ARTIteratorTest_singleLeafIteratorOneValue_Test_00380ff0;
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTIteratorTest, singleLeafIteratorOneValue) {
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert(0, unodb::test::test_values[0]);
  auto b = db.test_only_iterator();
  b.first();  // obtain iterator.
  UNODB_EXPECT_TRUE(b.valid());
  UNODB_EXPECT_EQ(decode(b.get_key()), 0);
  UNODB_EXPECT_TRUE(
      std::ranges::equal(b.get_val(), unodb::test::test_values[0]));
  b.next();                       // advance.
  UNODB_EXPECT_FALSE(b.valid());  // nothing more in the iterator.
}